

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O1

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall
LongReadsRecruiter::all_paths_fw
          (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *__return_storage_ptr__,LongReadsRecruiter *this,sgNodeID_t node)

{
  pointer pvVar1;
  int *piVar2;
  pointer pvVar3;
  pointer plVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> rids;
  vector<long,_std::allocator<long>_> local_80;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar5 = -node;
  if (0 < node) {
    lVar5 = node;
  }
  pvVar1 = (this->node_paths).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = pvVar1[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = *(pointer *)
            ((long)&pvVar1[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar7 != piVar2) {
    do {
      iVar6 = -*piVar7;
      if (-1 < node) {
        iVar6 = *piVar7;
      }
      path_fw(&local_80,this,(long)iVar6,node);
      std::
      vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
      ::emplace_back<std::vector<long,std::allocator<long>>>
                ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                  *)__return_storage_ptr__,&local_80);
      if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar3 = (__return_storage_ptr__->
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      plVar4 = pvVar3[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((plVar4 == pvVar3[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish) &&
         ((__return_storage_ptr__->
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pvVar3 + -1, plVar4 != (pointer)0x0)) {
        operator_delete(plVar4,(long)pvVar3[-1].super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)plVar4);
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
  }
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<sgNodeID_t> > LongReadsRecruiter::all_paths_fw(sgNodeID_t node) const {
    std::vector<std::vector<sgNodeID_t> > r;
    std::unordered_set<seqID_t> rids;
    for (auto rid:node_paths[llabs(node)] ){
        if (node<0) rid=-rid;
        r.emplace_back(path_fw(rid,node));
        if (r.back().empty()) r.pop_back();

    }
    return r;
}